

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pockle.c
# Opt level: O0

strbuf * pockle_mpu(Pockle *pockle,mp_int *p)

{
  PocklePrimeRecord *pPVar1;
  strbuf *sb_00;
  void *pvVar2;
  void *__s;
  size_t sVar3;
  ulong uVar4;
  ulong local_48;
  size_t i_1;
  size_t i;
  size_t index;
  _Bool *needed;
  PocklePrimeRecord *pr;
  strbuf *sb;
  mp_int *p_local;
  Pockle *pockle_local;
  
  sb_00 = strbuf_new_nm();
  pvVar2 = find234(pockle->tree,p,ppr_find);
  if (pvVar2 == (void *)0x0) {
    __assert_fail("pr",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/pockle.c"
                  ,0x197,"strbuf *pockle_mpu(Pockle *, mp_int *)");
  }
  __s = safemalloc(pockle->nlist,1,0);
  memset(__s,0,pockle->nlist);
  *(undefined1 *)((long)__s + *(long *)((long)pvVar2 + 0x20)) = 1;
  BinarySink_put_fmt(sb_00->binarysink_,
                     "[MPU - Primality Certificate]\nVersion 1.0\nBase 10\n\nProof for:\nN  ");
  mp_write_decimal(sb_00,p);
  BinarySink_put_fmt(sb_00->binarysink_,"\n");
  i = pockle->nlist;
  while( true ) {
    while( true ) {
      do {
        uVar4 = i - 1;
        if (i == 0) {
          safefree(__s);
          return sb_00;
        }
        i = uVar4;
      } while ((*(byte *)((long)__s + uVar4) & 1) == 0);
      pPVar1 = pockle->list[uVar4];
      sVar3 = mp_get_nbits(pPVar1->prime);
      if (0x40 < sVar3) break;
      BinarySink_put_fmt(sb_00->binarysink_,"\nType Small\nN  ");
      mp_write_decimal(sb_00,pPVar1->prime);
      BinarySink_put_fmt(sb_00->binarysink_,"\n");
    }
    if (pPVar1->witness == (mp_int *)0x0) break;
    BinarySink_put_fmt(sb_00->binarysink_,"\nType BLS5\nN  ");
    mp_write_decimal(sb_00,pPVar1->prime);
    BinarySink_put_fmt(sb_00->binarysink_,"\n");
    for (i_1 = 0; i_1 < pPVar1->nfactors; i_1 = i_1 + 1) {
      BinarySink_put_fmt(sb_00->binarysink_,"Q[%zu]  ",i_1 + 1);
      mp_write_decimal(sb_00,pPVar1->factors[i_1]->prime);
      if (uVar4 <= pPVar1->factors[i_1]->index) {
        __assert_fail("pr->factors[i]->index < index",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/pockle.c"
                      ,0x1b3,"strbuf *pockle_mpu(Pockle *, mp_int *)");
      }
      *(undefined1 *)((long)__s + pPVar1->factors[i_1]->index) = 1;
      BinarySink_put_fmt(sb_00->binarysink_,"\n");
    }
    for (local_48 = 0; local_48 < pPVar1->nfactors + 1; local_48 = local_48 + 1) {
      BinarySink_put_fmt(sb_00->binarysink_,"A[%zu]  ",local_48);
      mp_write_decimal(sb_00,pPVar1->witness);
      BinarySink_put_fmt(sb_00->binarysink_,"\n");
    }
    BinarySink_put_fmt(sb_00->binarysink_,"----\n");
  }
  __assert_fail("pr->witness",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/pockle.c",
                0x1ac,"strbuf *pockle_mpu(Pockle *, mp_int *)");
}

Assistant:

strbuf *pockle_mpu(Pockle *pockle, mp_int *p)
{
    strbuf *sb = strbuf_new_nm();
    PocklePrimeRecord *pr = find234(pockle->tree, p, ppr_find);
    assert(pr);

    bool *needed = snewn(pockle->nlist, bool);
    memset(needed, 0, pockle->nlist * sizeof(bool));
    needed[pr->index] = true;

    put_fmt(sb, "[MPU - Primality Certificate]\nVersion 1.0\nBase 10\n\n"
            "Proof for:\nN  ");
    mp_write_decimal(sb, p);
    put_fmt(sb, "\n");

    for (size_t index = pockle->nlist; index-- > 0 ;) {
        if (!needed[index])
            continue;
        pr = pockle->list[index];

        if (mp_get_nbits(pr->prime) <= 64) {
            put_fmt(sb, "\nType Small\nN  ");
            mp_write_decimal(sb, pr->prime);
            put_fmt(sb, "\n");
        } else {
            assert(pr->witness);
            put_fmt(sb, "\nType BLS5\nN  ");
            mp_write_decimal(sb, pr->prime);
            put_fmt(sb, "\n");
            for (size_t i = 0; i < pr->nfactors; i++) {
                put_fmt(sb, "Q[%"SIZEu"]  ", i+1);
                mp_write_decimal(sb, pr->factors[i]->prime);
                assert(pr->factors[i]->index < index);
                needed[pr->factors[i]->index] = true;
                put_fmt(sb, "\n");
            }
            for (size_t i = 0; i < pr->nfactors + 1; i++) {
                put_fmt(sb, "A[%"SIZEu"]  ", i);
                mp_write_decimal(sb, pr->witness);
                put_fmt(sb, "\n");
            }
            put_fmt(sb, "----\n");
        }
    }
    sfree(needed);

    return sb;
}